

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O3

CMFormat INT_CMregister_format(CManager cm,FMStructDescList format_list)

{
  CMFormat format;
  int iVar1;
  int iVar2;
  uint uVar3;
  CMFormat format_00;
  size_t sVar4;
  char *pcVar5;
  CMFormat *pp_Var6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  lVar9 = 0;
  if (cm == (CManager)0x0 || format_list == (FMStructDescList)0x0) {
    return (CMFormat)0x0;
  }
  format_00 = (CMFormat)INT_CMmalloc(0x48);
  format_00->cm = cm;
  sVar4 = strlen(format_list->format_name);
  pcVar5 = (char *)INT_CMmalloc(sVar4 + 1);
  format_00->format_name = pcVar5;
  strcpy(pcVar5,format_list->format_name);
  format_00->fmformat = (FMFormat)0x0;
  format_00->format_list_addr = format_list;
  format_00->handler = (CMHandlerFunc)0x0;
  format_00->client_data = (void *)0x0;
  format_00->format_list = format_list;
  format_00->registration_pending = 1;
  iVar7 = cm->reg_format_count;
  if (iVar7 < 1) {
    iVar8 = 0;
  }
  else {
    pcVar5 = format_00->format_name;
    lVar9 = 0;
    iVar1 = 0;
    do {
      format = cm->reg_formats[lVar9];
      iVar2 = strcmp(pcVar5,format->format_name);
      iVar8 = (int)lVar9;
      if (iVar2 < 0) break;
      if (iVar2 == 0) {
        if (format->registration_pending != 0) {
          CMcomplete_format_registration(format,0);
        }
        if ((format_00->registration_pending != 0) &&
           (CMcomplete_format_registration(format_00,0), format_00->registration_pending != 0)) {
          if (0 < (long)cm->in_format_count) {
            lVar9 = 0;
            do {
              if (*(FFSTypeHandle *)((long)&cm->in_formats->format + lVar9) == format_00->ffsformat)
              {
                free(format_00->format_name);
                free(format_00);
                return *(CMFormat *)((long)&cm->in_formats->f2_format + lVar9);
              }
              lVar9 = lVar9 + 0x48;
            } while ((long)cm->in_format_count * 0x48 != lVar9);
          }
          puts("Gack, duplicate format, but didn\'t find it");
          return (CMFormat)0x0;
        }
        uVar3 = FMformat_cmp(format_00->fmformat,cm->reg_formats[lVar9]->fmformat);
        iVar7 = cm->reg_format_count;
        if ((uVar3 & 0xfffffffd) == 1) break;
        if (uVar3 == 2) {
          iVar1 = iVar8;
        }
      }
      iVar8 = iVar1;
      lVar9 = lVar9 + 1;
      iVar1 = iVar8;
    } while (lVar9 < iVar7);
  }
  if ((int)lVar9 == iVar7) {
    iVar8 = (int)lVar9;
  }
  pp_Var6 = (CMFormat *)INT_CMrealloc(cm->reg_formats,(long)iVar7 * 8 + 8);
  cm->reg_formats = pp_Var6;
  iVar7 = cm->reg_format_count;
  lVar9 = (long)iVar7;
  if (iVar8 < iVar7) {
    do {
      cm->reg_formats[lVar9] = cm->reg_formats[lVar9 + -1];
      lVar9 = lVar9 + -1;
    } while (iVar8 < lVar9);
    pp_Var6 = cm->reg_formats;
  }
  pp_Var6[iVar8] = format_00;
  cm->reg_format_count = iVar7 + 1;
  return format_00;
}

Assistant:

CMFormat
INT_CMregister_format(CManager cm, FMStructDescList format_list)
{
    CMFormat format;

    if ((format_list == NULL) || (cm == NULL)) 
	return NULL;

    format = INT_CMmalloc(sizeof(struct _CMFormat));
    
    format->cm = cm;
    format->format_name = INT_CMmalloc(strlen(format_list[0].format_name) + 1);
    strcpy(format->format_name, format_list[0].format_name);
    format->fmformat = NULL;
    format->format_list_addr = format_list;
    format->handler = (CMHandlerFunc) NULL;
    format->client_data = NULL;
    format->format_list = format_list;
    format->registration_pending = 1;

    format = add_format_to_cm(cm, format);
    return format;
}